

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

MMAL_STATUS_T __thiscall
raspicam::_private::Private_Impl_Still::connectPorts
          (Private_Impl_Still *this,MMAL_PORT_T *output_port,MMAL_PORT_T *input_port,
          MMAL_CONNECTION_T **connection)

{
  MMAL_CONNECTION_T **in_RCX;
  MMAL_PORT_T *in_RDX;
  MMAL_PORT_T *in_RSI;
  MMAL_STATUS_T status;
  MMAL_STATUS_T local_24;
  
  local_24 = mmal_connection_create(in_RCX,in_RSI,in_RDX,3);
  if ((local_24 == MMAL_SUCCESS) &&
     (local_24 = mmal_connection_enable(*in_RCX), local_24 != MMAL_SUCCESS)) {
    mmal_connection_destroy(*in_RCX);
  }
  return local_24;
}

Assistant:

MMAL_STATUS_T Private_Impl_Still::connectPorts ( MMAL_PORT_T *output_port, MMAL_PORT_T *input_port, MMAL_CONNECTION_T **connection ) {
            MMAL_STATUS_T status =  mmal_connection_create ( connection, output_port, input_port, MMAL_CONNECTION_FLAG_TUNNELLING | MMAL_CONNECTION_FLAG_ALLOCATION_ON_INPUT );
            if ( status == MMAL_SUCCESS ) {
                status =  mmal_connection_enable ( *connection );
                if ( status != MMAL_SUCCESS )
                    mmal_connection_destroy ( *connection );
            }

            return status;
        }